

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gzwrite.c
# Opt level: O0

int cm_zlib_gzputc(gzFile file,int c)

{
  int iVar1;
  z_size_t zVar2;
  z_streamp strm;
  gz_statep state;
  uint local_20;
  uint uStack_1c;
  uchar buf [1];
  uint have;
  int c_local;
  gzFile file_local;
  
  if (file == (gzFile)0x0) {
    file_local._4_4_ = 0xffffffff;
  }
  else if ((file[1].have == 0x79b1) && (*(int *)((long)&file[4].pos + 4) == 0)) {
    uStack_1c = c;
    if ((int)file[4].pos != 0) {
      *(undefined4 *)&file[4].pos = 0;
      iVar1 = gz_zero((gz_statep)file,(off_t)file[4].next);
      if (iVar1 == -1) {
        return -1;
      }
    }
    state._7_1_ = (undefined1)uStack_1c;
    if ((int)file[1].pos != 0) {
      if ((int)file[5].pos == 0) {
        file[5].next = *(uchar **)(file + 2);
      }
      local_20 = ((int)file[5].next + (int)file[5].pos) - (int)*(undefined8 *)(file + 2);
      if (local_20 < (uint)file[1].pos) {
        *(undefined1 *)(*(long *)(file + 2) + (ulong)local_20) = state._7_1_;
        *(int *)&file[5].pos = (int)file[5].pos + 1;
        file->pos = file->pos + 1;
        return uStack_1c & 0xff;
      }
    }
    zVar2 = gz_write((gz_statep)file,(voidpc)((long)&state + 7),1);
    if (zVar2 == 1) {
      file_local._4_4_ = uStack_1c & 0xff;
    }
    else {
      file_local._4_4_ = 0xffffffff;
    }
  }
  else {
    file_local._4_4_ = 0xffffffff;
  }
  return file_local._4_4_;
}

Assistant:

int ZEXPORT gzputc(file, c)
    gzFile file;
    int c;
{
    unsigned have;
    unsigned char buf[1];
    gz_statep state;
    z_streamp strm;

    /* get internal structure */
    if (file == NULL)
        return -1;
    state = (gz_statep)file;
    strm = &(state->strm);

    /* check that we're writing and that there's no error */
    if (state->mode != GZ_WRITE || state->err != Z_OK)
        return -1;

    /* check for seek request */
    if (state->seek) {
        state->seek = 0;
        if (gz_zero(state, state->skip) == -1)
            return -1;
    }

    /* try writing to input buffer for speed (state->size == 0 if buffer not
       initialized) */
    if (state->size) {
        if (strm->avail_in == 0)
            strm->next_in = state->in;
        have = (unsigned)((strm->next_in + strm->avail_in) - state->in);
        if (have < state->size) {
            state->in[have] = (unsigned char)c;
            strm->avail_in++;
            state->x.pos++;
            return c & 0xff;
        }
    }

    /* no room in buffer or not initialized, use gz_write() */
    buf[0] = (unsigned char)c;
    if (gz_write(state, buf, 1) != 1)
        return -1;
    return c & 0xff;
}